

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O1

void laguerre_poly(int n,double x,double *cx)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  
  if (((-1 < n) && (*cx = 1.0, n != 0)) && (cx[1] = 1.0 - x, 1 < n)) {
    dVar4 = cx[1];
    uVar1 = 2;
    iVar2 = -1;
    iVar3 = 3;
    do {
      dVar4 = ((double)iVar2 * cx[uVar1 - 2] + ((double)iVar3 - x) * dVar4) / (double)(int)uVar1;
      cx[uVar1] = dVar4;
      uVar1 = uVar1 + 1;
      iVar2 = iVar2 + -1;
      iVar3 = iVar3 + 2;
    } while (n + 1 != uVar1);
  }
  return;
}

Assistant:

BURKHARDT_EXPORT
void laguerre_poly ( int n, double x, double cx[] )

//****************************************************************************80
//
//  Purpose:
//
//    LAGUERRE_POLY evaluates the Laguerre polynomials at X.
//
//  Differential equation:
//
//    X * Y'' + (1-X) * Y' + N * Y = 0
//
//  First terms:
//
//      1
//     -X    +  1
//   (  X^2 -  4 X     +  2 ) / 2
//   ( -X^3 +  9 X^2 -  18 X    +    6 ) / 6
//   (  X^4 - 16 X^3 +  72 X^2 -   96 X +      24 ) / 24
//   ( -X^5 + 25 X^4 - 200 X^3 +  600 X^2 -  600 x    +  120 ) / 120
//   (  X^6 - 36 X^5 + 450 X^4 - 2400 X^3 + 5400 X^2 - 4320 X + 720 ) / 720
//   ( -X^7 + 49 X^6 - 882 X^5 + 7350 X^4 - 29400 X^3
//      + 52920 X^2 - 35280 X + 5040 ) / 5040
//
//  Recursion:
//
//    L(0,X) = 1,
//    L(1,X) = 1-X,
//    N * L(N,X) = (2*N-1-X) * L(N-1,X) - (N-1) * L(N-2,X)
//
//  Orthogonality:
//
//    Integral ( 0 <= X < +oo ) exp ( - X ) * L(N,X) * L(M,X) dX
//    = 0 if N /= M
//    = 1 if N == M
//
//  Special values:
//
//    L(N,0) = 1.
//
//  Relations:
//
//    L(N,X) = (-1)^N / N! * exp ( x ) * (d/dx)^n ( exp ( - x ) * x^n )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    01 February 2003
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input, int N, the highest order polynomial to compute.
//    Note that polynomials 0 through N will be computed.
//
//    Input, double X, the point at which the polynomials are to be evaluated.
//
//    Output, double CX[N+1], the Laguerre polynomials of degree 0 through
//    N evaluated at the point X.
//
{
  int i;

  if ( n < 0 )
  {
    return;
  }

  cx[0] = 1.0;

  if ( n == 0 )
  {
    return;
  }

  cx[1] = 1.0 - x;

  for ( i = 2; i <= n; i++ )
  {
    cx[i] = ( ( double( 2 * i - 1 ) - x ) * cx[i-1] 
              + double(   - i + 1 )       * cx[i-2] ) 
              / double(     i     );

  }

  return;
}